

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

ostream * operator<<(ostream *stream,Fad<double> *x)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  
  lVar3 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar3 + -0x18) + 0x10) = 8;
  lVar3 = *(long *)(lVar3 + -0x18);
  *(uint *)(stream + lVar3 + 0x18) = *(uint *)(stream + lVar3 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::ostream::_M_insert<double>(x->val_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," dx: ",5);
  if (0 < (x->dx_).num_elts) {
    lVar3 = 0;
    do {
      lVar1 = *(long *)stream;
      *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 8;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
      poVar2 = std::ostream::_M_insert<double>((x->dx_).ptr_to_data[lVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (x->dx_).num_elts);
  }
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const Fad<T>& x)
  {
      const int VAL_WIDTH = 8;
      stream << std::setw(VAL_WIDTH)<<std::right<<x.val()<<" dx: ";
      for (int i=0; i<x.dx_.size(); i++) {
          stream << std::setw(VAL_WIDTH)<<std::right<< x.dx_[i] << " ";
      }
      return stream;
  }